

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int nn_sws_recv(nn_pipebase *self,nn_msg *msg)

{
  nn_chunkref *self_00;
  nn_list *self_01;
  int iVar1;
  msg_chunk *it;
  void *pvVar2;
  void *__src;
  size_t sVar3;
  undefined8 *puVar4;
  byte bVar5;
  size_t sVar6;
  nn_sws *self_02;
  
  self_02 = (nn_sws *)&self[-0x1a].out.type;
  if (self == (nn_pipebase *)0x0) {
    self_02 = (nn_sws *)0x0;
  }
  if (self_02->state == 4) {
    if (self_02->instate == 5) {
      if (self_02->is_final_frame == 0) goto LAB_0015c902;
      bVar5 = self_02->inhdr[0];
      if (-1 < (char)bVar5) goto LAB_0015c90c;
      if (0xfd < (byte)((bVar5 & 0xf) - 0xb)) {
        nn_msg_init(msg,self_02->inmsg_current_chunk_len);
        pvVar2 = nn_chunkref_data(&msg->body);
        memcpy(pvVar2,self_02->inmsg_control,self_02->inmsg_current_chunk_len);
LAB_0015c8a7:
        nn_sws_recv_hdr(self_02);
        nn_chunkref_init(&msg->hdrs,0x18);
        puVar4 = (undefined8 *)nn_chunkref_data(&msg->hdrs);
        puVar4[1] = 0x1fffffffc;
        *puVar4 = 0x18;
        *(byte *)(puVar4 + 2) = bVar5 & 0x7f;
        return 0;
      }
      goto LAB_0015c916;
    }
    if (self_02->instate != 4) goto LAB_0015c92a;
    if (self_02->is_final_frame == 0) goto LAB_0015c907;
    bVar5 = self_02->inmsg_hdr;
    if (-1 < (char)bVar5) goto LAB_0015c911;
    if ((byte)((bVar5 & 0xf) - 3) < 0xfe) goto LAB_0015c91b;
    nn_msg_init(msg,self_02->inmsg_total_size);
    self_01 = &self_02->inmsg_array;
    iVar1 = nn_list_empty(self_01);
    if (iVar1 == 0) {
      sVar6 = 0;
      do {
        it = (msg_chunk *)nn_list_begin(self_01);
        pvVar2 = nn_chunkref_data(&msg->body);
        self_00 = &it->chunk;
        __src = nn_chunkref_data(self_00);
        sVar3 = nn_chunkref_size(self_00);
        memcpy((void *)((long)pvVar2 + sVar6),__src,sVar3);
        sVar3 = nn_chunkref_size(self_00);
        sVar6 = sVar6 + sVar3;
        nn_msg_chunk_term(it,self_01);
        iVar1 = nn_list_empty(self_01);
      } while (iVar1 == 0);
    }
    else {
      sVar6 = 0;
    }
    if (sVar6 != self_02->inmsg_total_size) goto LAB_0015c920;
    iVar1 = nn_list_empty(self_01);
    if (iVar1 != 0) {
      self_02->continuing = 0;
      goto LAB_0015c8a7;
    }
  }
  else {
    nn_sws_recv_cold_1();
LAB_0015c902:
    nn_sws_recv_cold_4();
LAB_0015c907:
    nn_sws_recv_cold_9();
LAB_0015c90c:
    nn_sws_recv_cold_3();
LAB_0015c911:
    nn_sws_recv_cold_8();
LAB_0015c916:
    nn_sws_recv_cold_2();
LAB_0015c91b:
    nn_sws_recv_cold_7();
LAB_0015c920:
    nn_sws_recv_cold_5();
  }
  nn_sws_recv_cold_6();
LAB_0015c92a:
  nn_sws_recv_cold_10();
}

Assistant:

static int nn_sws_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sws *sws;
    struct nn_list_item *it;
    struct msg_chunk *ch;
    struct nn_cmsghdr *cmsg;
    uint8_t opcode_hdr;
    uint8_t opcode;
    size_t cmsgsz;
    size_t pos;

    sws = nn_cont (self, struct nn_sws, pipebase);

    nn_assert_state (sws, NN_SWS_STATE_ACTIVE);

    switch (sws->instate) {
    case NN_SWS_INSTATE_RECVD_CHUNKED:

        /*  Relay opcode to the user in order to interpret payload. */
        opcode_hdr = sws->inmsg_hdr;

        /*  This library should not deliver fragmented messages to the
            application, so it's expected that this is the final frame. */
        nn_assert (sws->is_final_frame);
        nn_assert (opcode_hdr & NN_SWS_FRAME_BITMASK_FIN);
        opcode_hdr &= ~NN_SWS_FRAME_BITMASK_FIN;

        /*  The library is expected to have failed any connections with other
            opcodes; these are the only two opcodes that can be chunked. */
        opcode = opcode_hdr & NN_SWS_FRAME_BITMASK_OPCODE;
        nn_assert (opcode == NN_WS_OPCODE_BINARY ||
                   opcode == NN_WS_OPCODE_TEXT);

        nn_msg_init (msg, sws->inmsg_total_size);

        pos = 0;

        /*  Reassemble incoming message scatter array. */
        while (!nn_list_empty (&sws->inmsg_array)) {
            it = nn_list_begin (&sws->inmsg_array);
            ch = nn_cont (it, struct msg_chunk, item);
            memcpy (((uint8_t*) nn_chunkref_data (&msg->body)) + pos,
                nn_chunkref_data (&ch->chunk),
                nn_chunkref_size (&ch->chunk));
            pos += nn_chunkref_size (&ch->chunk);
            nn_msg_chunk_term (ch, &sws->inmsg_array);
        }

        nn_assert (pos == sws->inmsg_total_size);
        nn_assert (nn_list_empty (&sws->inmsg_array));

        /*  No longer collecting scatter array of incoming msg chunks. */
        sws->continuing = 0;

        nn_sws_recv_hdr (sws);

        break;

    case NN_SWS_INSTATE_RECVD_CONTROL:

        /*  Relay opcode to the user in order to interpret payload. */
        opcode_hdr = sws->inhdr [0];

        /*  This library should not deliver fragmented messages to the
            application, so it's expected that this is the final frame. */
        nn_assert (sws->is_final_frame);
        nn_assert (opcode_hdr & NN_SWS_FRAME_BITMASK_FIN);
        opcode_hdr &= ~NN_SWS_FRAME_BITMASK_FIN;

        /*  The library is expected to have failed any connections with other
            opcodes; these are the only two control opcodes delivered. */
        opcode = opcode_hdr & NN_SWS_FRAME_BITMASK_OPCODE;
        nn_assert (opcode == NN_WS_OPCODE_PING ||
                   opcode == NN_WS_OPCODE_PONG);

        nn_msg_init (msg, sws->inmsg_current_chunk_len);

        memcpy (((uint8_t*) nn_chunkref_data (&msg->body)),
            sws->inmsg_control, sws->inmsg_current_chunk_len);

        nn_sws_recv_hdr (sws);

        break;

    default:
        /*  Unexpected state. */
        nn_assert (0);
        break;
    }

    /*  Allocate and populate WebSocket-specific control headers. */
    cmsgsz = NN_CMSG_SPACE (sizeof (opcode_hdr));
    nn_chunkref_init (&msg->hdrs, cmsgsz);
    cmsg = nn_chunkref_data (&msg->hdrs);
    cmsg->cmsg_level = NN_WS;
    cmsg->cmsg_type = NN_WS_MSG_TYPE;
    cmsg->cmsg_len = cmsgsz;
    memcpy (NN_CMSG_DATA (cmsg), &opcode_hdr, sizeof (opcode_hdr));

    return 0;
}